

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.hpp
# Opt level: O3

void __thiscall
jessilib::io::formatted_message::formatted_message<jessilib::io::text&,jessilib::io::text&>
          (formatted_message *this,u8string *in_format,text *args,text *args_1)

{
  anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  long lVar5;
  long *plVar6;
  initializer_list<jessilib::io::text> __l;
  allocator_type local_89;
  text local_88;
  long *local_58 [2];
  long local_48 [2];
  undefined8 local_38;
  uint32_t local_30;
  
  paVar1 = &(this->m_format).field_2;
  (this->m_format)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (in_format->_M_dataplus)._M_p;
  paVar2 = &in_format->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&in_format->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->m_format).field_2 + 8) = uVar4;
  }
  else {
    (this->m_format)._M_dataplus._M_p = pcVar3;
    (this->m_format).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->m_format)._M_string_length = in_format->_M_string_length;
  (in_format->_M_dataplus)._M_p = (pointer)paVar2;
  in_format->_M_string_length = 0;
  (in_format->field_2)._M_local_buf[0] = '\0';
  local_88.m_string._M_dataplus._M_p = (pointer)&local_88.m_string.field_2;
  pcVar3 = (args->m_string)._M_dataplus._M_p;
  std::__cxx11::u8string::_M_construct<char8_t*>
            ((u8string *)&local_88,pcVar3,pcVar3 + (args->m_string)._M_string_length);
  local_88.m_color_bg.m_value = (args->m_color_bg).m_value;
  local_88.m_properties = args->m_properties;
  local_88.m_color.m_value = (args->m_color).m_value;
  plVar6 = local_48;
  pcVar3 = (args_1->m_string)._M_dataplus._M_p;
  local_58[0] = plVar6;
  std::__cxx11::u8string::_M_construct<char8_t*>
            ((u8string *)local_58,pcVar3,pcVar3 + (args_1->m_string)._M_string_length);
  local_30 = (args_1->m_color_bg).m_value;
  local_38._0_4_ = args_1->m_properties;
  local_38._4_4_ = args_1->m_color;
  __l._M_len = 2;
  __l._M_array = &local_88;
  std::vector<jessilib::io::text,_std::allocator<jessilib::io::text>_>::vector
            (&this->m_message,__l,&local_89);
  lVar5 = -0x60;
  do {
    if (plVar6 != (long *)plVar6[-2]) {
      operator_delete((long *)plVar6[-2],*plVar6 + 1);
    }
    plVar6 = plVar6 + -6;
    lVar5 = lVar5 + 0x30;
  } while (lVar5 != 0);
  return;
}

Assistant:

formatted_message(std::u8string in_format, Args&& ... args)
		: m_format{ std::move(in_format) },
		m_message{ std::forward<Args>(args)... } {
		// Empty ctor body
	}